

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O3

void __thiscall
onmt::Tokenizer::parse_tokens
          (Tokenizer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *features,vector<onmt::Token,_std::allocator<onmt::Token>_> *tokens,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *index_map)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  iterator __position;
  Casing CVar4;
  CaseMarkupType CVar5;
  pointer pvVar6;
  runtime_error *this_00;
  ulong uVar7;
  pointer pbVar8;
  long lVar9;
  Token token;
  unsigned_long local_c8;
  Casing local_bc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  Tokenizer *local_b0;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_a8;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_b0 = this;
  local_a0 = tokens;
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::reserve
            (tokens,(long)(words->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(words->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5);
  if (index_map != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (index_map,
               (long)(words->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(words->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5);
  }
  local_c8 = 0;
  pbVar8 = (words->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((words->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar8) {
    local_bc = None;
    CVar4 = None;
    local_b8 = words;
    local_a8 = (vector<unsigned_long,std::allocator<unsigned_long>> *)index_map;
    do {
      if (pbVar8[local_c8]._M_string_length != 0) {
        if ((local_b0->_options).case_feature == true) {
          pvVar6 = (features->
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (pvVar6 == (features->
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Missing case feature");
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          CVar4 = char_to_casing(*(pvVar6->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[local_c8]._M_dataplus.
                                  _M_p);
          uVar7 = 1;
LAB_001b338a:
          annotate_token((Token *)local_78,local_b0,
                         (local_b8->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_c8);
          pvVar6 = (features->
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pvVar1 = (features->
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_78._36_4_ = CVar4;
          if ((pvVar6 != pvVar1) &&
             (uVar7 < (ulong)(((long)pvVar1 - (long)pvVar6 >> 3) * -0x5555555555555555))) {
            lVar9 = (ulong)(uint)((int)uVar7 * 8) * 3;
            do {
              lVar2 = *(long *)((long)&(pvVar6->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + lVar9);
              lVar3 = *(long *)(lVar2 + local_c8 * 0x20);
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_98,lVar3,*(long *)(lVar2 + 8 + local_c8 * 0x20) + lVar3);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_48,&local_98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              uVar7 = uVar7 + 1;
              pvVar6 = (features->
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              lVar9 = lVar9 + 0x18;
            } while (uVar7 < (ulong)(((long)(features->
                                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pvVar6 >> 3) * -0x5555555555555555));
          }
          if (local_78._8_8_ != 0) {
            CVar4 = None;
          }
          std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
                    (local_a0,(Token *)local_78);
          if (local_a8 != (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0) {
            __position._M_current = *(unsigned_long **)(local_a8 + 8);
            if (__position._M_current == *(unsigned_long **)(local_a8 + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(local_a8,__position,&local_c8);
            }
            else {
              *__position._M_current = local_c8;
              *(unsigned_long **)(local_a8 + 8) = __position._M_current + 1;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          words = local_b8;
          if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
            words = local_b8;
          }
        }
        else {
          CVar5 = read_case_markup(pbVar8 + local_c8);
          words = local_b8;
          if (CVar5 == Modifier) {
            CVar4 = get_casing_from_markup
                              ((local_b8->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + local_c8);
          }
          else if (CVar5 == RegionEnd) {
            local_bc = None;
            CVar4 = None;
          }
          else {
            if (CVar5 != RegionBegin) {
              if (CVar4 == None) {
                CVar4 = local_bc;
              }
              uVar7 = 0;
              goto LAB_001b338a;
            }
            local_bc = get_casing_from_markup
                                 ((local_b8->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + local_c8);
            words = local_b8;
            CVar4 = None;
          }
        }
      }
      local_c8 = local_c8 + 1;
      pbVar8 = (words->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (local_c8 <
             (ulong)((long)(words->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5));
  }
  return;
}

Assistant:

void Tokenizer::parse_tokens(const std::vector<std::string>& words,
                               const std::vector<std::vector<std::string>>& features,
                               std::vector<Token>& tokens,
                               std::vector<size_t>* index_map) const
  {
    tokens.reserve(words.size());
    if (index_map)
      index_map->reserve(words.size());
    Casing case_region = Casing::None;
    Casing case_modifier = Casing::None;

    for (size_t i = 0; i < words.size(); ++i)
    {
      if (words[i].empty())
        continue;

      size_t features_offset = 0;
      if (_options.case_feature)
      {
        if (features.empty())
          throw std::runtime_error("Missing case feature");
        case_modifier = char_to_casing(features[0][i][0]);
        features_offset = 1;
      }
      else
      {
        auto case_markup = read_case_markup(words[i]);
        switch (case_markup)
        {
        case CaseMarkupType::RegionBegin:
          case_region = get_casing_from_markup(words[i]);
          case_modifier = Casing::None;
          continue;
        case CaseMarkupType::RegionEnd:
          case_region = Casing::None;
          case_modifier = Casing::None;
          continue;
        case CaseMarkupType::Modifier:
          case_modifier = get_casing_from_markup(words[i]);
          continue;
        default:
          case_modifier = (case_modifier != Casing::None ? case_modifier : case_region);
          break;
        }
      }

      Token token = annotate_token(words[i]);
      token.casing = case_modifier;
      if (!features.empty())
      {
        for (size_t j = features_offset; j < features.size(); ++j)
          token.append_feature(features[j][i]);
      }
      // Forward the case modifier if the current token is a joiner or spacer.
      if (!token.empty())
        case_modifier = Casing::None;

      tokens.emplace_back(std::move(token));
      if (index_map)
        index_map->push_back(i);
    }
  }